

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

Aig_Obj_t * Aig_ObjChild1Copy(Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *local_18;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 == 0) {
    pAVar2 = Aig_ObjFanin1(pObj);
    if (pAVar2 == (Aig_Obj_t *)0x0) {
      local_18 = (Aig_Obj_t *)0x0;
    }
    else {
      pAVar2 = Aig_ObjFanin1(pObj);
      pAVar2 = (Aig_Obj_t *)(pAVar2->field_5).pData;
      iVar1 = Aig_ObjFaninC1(pObj);
      local_18 = Aig_NotCond(pAVar2,iVar1);
    }
    return local_18;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                ,0x139,"Aig_Obj_t *Aig_ObjChild1Copy(Aig_Obj_t *)");
}

Assistant:

static inline Aig_Obj_t *  Aig_ObjChild1Copy( Aig_Obj_t * pObj )  { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin1(pObj)? Aig_NotCond((Aig_Obj_t *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj)) : NULL;  }